

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilFile.c
# Opt level: O3

char * Extra_StringAppend(char *pStrGiven,char *pStrAdd)

{
  size_t sVar1;
  size_t sVar2;
  char *pcVar3;
  
  if (pStrGiven != (char *)0x0) {
    sVar1 = strlen(pStrGiven);
    sVar2 = strlen(pStrAdd);
    pcVar3 = (char *)malloc(sVar1 + sVar2 + 2);
    sprintf(pcVar3,"%s%s",pStrGiven,pStrAdd);
    free(pStrGiven);
    return pcVar3;
  }
  pcVar3 = Extra_UtilStrsav(pStrAdd);
  return pcVar3;
}

Assistant:

char * Extra_StringAppend( char * pStrGiven, char * pStrAdd )
{
    char * pTemp;
    if ( pStrGiven )
    {
        pTemp = ABC_ALLOC( char, strlen(pStrGiven) + strlen(pStrAdd) + 2 );
        sprintf( pTemp, "%s%s", pStrGiven, pStrAdd );
        ABC_FREE( pStrGiven );
    }
    else
        pTemp = Extra_UtilStrsav( pStrAdd );
    return pTemp;
}